

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_test_control(int op,...)

{
  sqlite3_mutex **ppsVar1;
  ushort uVar2;
  Pgno PVar3;
  u64 *puVar4;
  int *piVar5;
  uint uVar6;
  sqlite3 *db;
  _func_int_void_ptr_void_ptr *p_Var7;
  uint uVar8;
  sqlite3 *psVar9;
  _func_int_void_ptr_void_ptr *p_Var10;
  char in_AL;
  byte bVar11;
  short x_00;
  LogEst LVar12;
  int iVar13;
  u32 uVar14;
  uint uVar15;
  int iVar16;
  Bitvec *p;
  void *p_00;
  void *p_01;
  Pgno *pPVar17;
  u64 x_01;
  undefined8 in_RCX;
  ulong uVar18;
  undefined8 in_RDX;
  ulong uVar19;
  Pgno *pPVar20;
  undefined8 in_RSI;
  sqlite3PrngType *__src;
  sqlite3PrngType *__dest;
  undefined8 in_R8;
  undefined8 in_R9;
  uint uVar21;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int x;
  undefined1 local_118 [8];
  sqlite3 *local_110;
  _func_int_void_ptr_void_ptr *local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  double local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  uint local_5c;
  ulong local_58;
  Pgno *pPStack_50;
  undefined1 *local_48;
  long local_38;
  
  p_Var7 = local_108;
  db = local_110;
  local_48 = local_118;
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = 0x3000000008;
  pPStack_50 = (Pgno *)&stack0x00000008;
  uVar21 = 0;
  uVar6 = (uint)local_110;
  uVar15 = 0;
  psVar9 = (sqlite3 *)in_RSI;
  p_Var10 = (_func_int_void_ptr_void_ptr *)in_RDX;
  local_100 = in_RCX;
  local_f8 = in_R8;
  local_f0 = in_R9;
  switch(op) {
  case 5:
    __dest = &sqlite3SavedPrng;
    __src = &sqlite3Prng;
    goto LAB_0012fd9f;
  case 6:
    __dest = &sqlite3Prng;
    __src = &sqlite3SavedPrng;
LAB_0012fd9f:
    local_110 = (sqlite3 *)in_RSI;
    local_108 = (_func_int_void_ptr_void_ptr *)in_RDX;
    memcpy(__dest,__src,0x84);
    uVar15 = uVar21;
    psVar9 = local_110;
    p_Var10 = local_108;
    break;
  case 7:
    local_58 = 0x3000000018;
    if ((u32)local_108 == 0) {
      uVar18 = local_110->flags & 0xfffffff7ffffffff;
    }
    else {
      uVar18 = local_110->flags | 0x800000000;
    }
    local_110->flags = uVar18;
    uVar15 = uVar21;
    psVar9 = (sqlite3 *)in_RSI;
    p_Var10 = (_func_int_void_ptr_void_ptr *)in_RDX;
    break;
  case 8:
    local_58 = 0x3000000018;
    local_5c = 0xaaaaaaaa;
    local_110 = (sqlite3 *)in_RSI;
    local_108 = (_func_int_void_ptr_void_ptr *)in_RDX;
    p = (Bitvec *)sqlite3Malloc(0x200);
    if (p != (Bitvec *)0x0) {
      memset(p,0,0x200);
      p->iSize = uVar6;
    }
    iVar13 = uVar6 + 0xe;
    if (-1 < (int)(uVar6 + 7)) {
      iVar13 = uVar6 + 7;
    }
    p_00 = sqlite3MallocZero((long)((iVar13 >> 3) + 1));
    iVar13 = sqlite3_initialize();
    if (iVar13 == 0) {
      p_01 = sqlite3Malloc(0x200);
    }
    else {
      p_01 = (void *)0x0;
    }
    uVar15 = 0xffffffff;
    if ((p_01 != (void *)0x0 && p != (Bitvec *)0x0) && p_00 != (void *)0x0) {
      local_5c = 0;
      uVar18 = 0;
      do {
        while( true ) {
          uVar15 = *(uint *)(p_Var7 + uVar18 * 4);
          if ((uVar15 - 1 < 2) || (uVar15 == 5)) {
            local_5c = *(int *)(p_Var7 + uVar18 * 4 + 8) - 1;
            *(int *)(p_Var7 + uVar18 * 4 + 8) =
                 *(int *)(p_Var7 + uVar18 * 4 + 8) + *(int *)(p_Var7 + uVar18 * 4 + 0xc);
            iVar13 = 4;
          }
          else {
            if (uVar15 == 0) {
              iVar13 = sqlite3BitvecTestNotNull(p,uVar6 + 1);
              iVar16 = sqlite3BitvecTestNotNull(p,0);
              uVar21 = (((p->iSize - uVar6) - (uint)(iVar13 == 0)) + 2) - (uint)(iVar16 == 0);
              local_5c = 1;
              uVar15 = uVar21;
              if ((int)uVar6 < 1) goto LAB_0013093e;
              goto LAB_001307b9;
            }
            sqlite3_randomness(4,&local_5c);
            iVar13 = 2;
          }
          if (1 < *(int *)(p_Var7 + uVar18 * 4 + 4)) {
            iVar13 = 0;
          }
          *(int *)(p_Var7 + uVar18 * 4 + 4) = *(int *)(p_Var7 + uVar18 * 4 + 4) + -1;
          local_5c = (uint)((long)(ulong)(local_5c & 0x7fffffff) % (long)(int)uVar6);
          uVar18 = (ulong)(uint)(iVar13 + (int)uVar18);
          uVar19 = (ulong)(local_5c + 1 >> 3);
          bVar11 = (byte)(1 << ((byte)(local_5c + 1) & 7));
          if ((uVar15 & 1) != 0) break;
          *(byte *)((long)p_00 + uVar19) = *(byte *)((long)p_00 + uVar19) & ~bVar11;
          sqlite3BitvecClear(p,local_5c + 1,p_01);
        }
        *(byte *)((long)p_00 + uVar19) = *(byte *)((long)p_00 + uVar19) | bVar11;
      } while ((uVar15 == 5) || (iVar13 = sqlite3BitvecSet(p,local_5c + 1), iVar13 == 0));
      uVar15 = 0xffffffff;
    }
    goto LAB_0013093e;
  case 9:
    local_58 = 0x3000000010;
    sqlite3Config.xTestCallback = (_func_int_int *)local_110;
    uVar15 = uVar21;
    psVar9 = (sqlite3 *)in_RSI;
    p_Var10 = (_func_int_void_ptr_void_ptr *)in_RDX;
    if (local_110 != (sqlite3 *)0x0) {
      local_110 = (sqlite3 *)in_RSI;
      local_108 = (_func_int_void_ptr_void_ptr *)in_RDX;
      uVar15 = (*(code *)db)(0);
      psVar9 = local_110;
      p_Var10 = local_108;
    }
    break;
  case 10:
    sqlite3Hooks_0 = local_110;
    local_58 = 0x3000000018;
    sqlite3Hooks_1 = local_108;
    uVar15 = uVar21;
    psVar9 = (sqlite3 *)in_RSI;
    p_Var10 = (_func_int_void_ptr_void_ptr *)in_RDX;
    break;
  case 0xb:
    local_58 = 0x3000000010;
    uVar15 = sqlite3PendingByte;
    psVar9 = (sqlite3 *)in_RSI;
    p_Var10 = (_func_int_void_ptr_void_ptr *)in_RDX;
    if ((uint)local_110 != 0) {
      uVar15 = sqlite3PendingByte;
      sqlite3PendingByte = (uint)local_110;
      psVar9 = (sqlite3 *)in_RSI;
      p_Var10 = (_func_int_void_ptr_void_ptr *)in_RDX;
    }
    break;
  case 0xc:
    local_5c = 0;
    uVar15 = 0;
    psVar9 = (sqlite3 *)in_RSI;
    p_Var10 = (_func_int_void_ptr_void_ptr *)in_RDX;
    break;
  case 0xd:
    local_58 = 0x3000000010;
    uVar15 = (uint)local_110;
    psVar9 = (sqlite3 *)in_RSI;
    p_Var10 = (_func_int_void_ptr_void_ptr *)in_RDX;
    break;
  case 0xf:
    local_58 = 0x3000000018;
    local_110->dbOptFlags = (u32)local_108;
    uVar15 = uVar21;
    psVar9 = (sqlite3 *)in_RSI;
    p_Var10 = (_func_int_void_ptr_void_ptr *)in_RDX;
    break;
  case 0x10:
    uVar14 = local_110->dbOptFlags;
    goto LAB_001300c3;
  case 0x11:
    local_58 = 0x3000000010;
    local_110->mDbFlags = local_110->mDbFlags ^ 0x20;
    uVar15 = uVar21;
    psVar9 = (sqlite3 *)in_RSI;
    p_Var10 = (_func_int_void_ptr_void_ptr *)in_RDX;
    break;
  case 0x12:
    local_58 = 0x3000000010;
    sqlite3Config.bLocaltimeFault = (uint)local_110;
    if ((uint)local_110 == 2) {
      local_58 = 0x3000000018;
      sqlite3Config.xAltLocaltime = local_108;
      uVar15 = uVar21;
      psVar9 = (sqlite3 *)in_RSI;
      p_Var10 = (_func_int_void_ptr_void_ptr *)in_RDX;
    }
    else {
      sqlite3Config.xAltLocaltime = (_func_int_void_ptr_void_ptr *)0x0;
      uVar15 = uVar21;
      psVar9 = (sqlite3 *)in_RSI;
      p_Var10 = (_func_int_void_ptr_void_ptr *)in_RDX;
    }
    break;
  case 0x13:
    local_58 = 0x3000000010;
    sqlite3Config.iOnceResetThreshold = (uint)local_110;
    uVar15 = uVar21;
    psVar9 = (sqlite3 *)in_RSI;
    p_Var10 = (_func_int_void_ptr_void_ptr *)in_RDX;
    break;
  case 0x14:
    local_58 = 0x3000000010;
    sqlite3Config.neverCorrupt = (uint)local_110;
    uVar15 = uVar21;
    psVar9 = (sqlite3 *)in_RSI;
    p_Var10 = (_func_int_void_ptr_void_ptr *)in_RDX;
    break;
  case 0x16:
    uVar15 = 0x1e212;
    psVar9 = (sqlite3 *)in_RSI;
    p_Var10 = (_func_int_void_ptr_void_ptr *)in_RDX;
    break;
  case 0x17:
    uVar15 = (uint)(sqlite3Config.isInit == 0);
    psVar9 = (sqlite3 *)in_RSI;
    p_Var10 = (_func_int_void_ptr_void_ptr *)in_RDX;
    break;
  case 0x18:
    local_58 = 0x3000000018;
    local_110->nMaxSorterMmap = (u32)local_108;
    uVar15 = uVar21;
    psVar9 = (sqlite3 *)in_RSI;
    p_Var10 = (_func_int_void_ptr_void_ptr *)in_RDX;
    break;
  case 0x19:
    local_58 = 0x3000000010;
    ppsVar1 = &local_110->mutex;
    local_110 = (sqlite3 *)in_RSI;
    local_108 = (_func_int_void_ptr_void_ptr *)in_RDX;
    if (*ppsVar1 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(*ppsVar1);
    }
    uVar18 = local_58 & 0xffffffff;
    if (uVar18 < 0x29) {
      local_58 = CONCAT44(local_58._4_4_,(int)local_58 + 8);
      pPVar17 = (Pgno *)(local_48 + uVar18);
    }
    else {
      pPVar17 = pPStack_50;
      pPStack_50 = pPStack_50 + 2;
    }
    iVar13 = sqlite3FindDbName(db,*(char **)pPVar17);
    if (-1 < iVar13) {
      (db->init).iDb = (u8)iVar13;
      uVar18 = local_58 & 0xffffffff;
      if (uVar18 < 0x29) {
        local_58 = CONCAT44(local_58._4_4_,(int)local_58 + 8);
        pPVar17 = (Pgno *)(local_48 + uVar18);
      }
      else {
        pPVar17 = pPStack_50;
        pPStack_50 = pPStack_50 + 2;
      }
      bVar11 = (byte)*pPVar17 & 1;
      (db->init).field_0x6 = (db->init).field_0x6 & 0xfd | bVar11 * '\x02';
      (db->init).busy = bVar11;
      uVar18 = local_58 & 0xffffffff;
      if (uVar18 < 0x29) {
        local_58 = CONCAT44(local_58._4_4_,(int)local_58 + 8);
        pPVar17 = (Pgno *)(local_48 + uVar18);
      }
      else {
        pPVar17 = pPStack_50;
        pPStack_50 = pPStack_50 + 2;
      }
      PVar3 = *pPVar17;
      (db->init).newTnum = PVar3;
      if (((db->init).busy == '\0') && (PVar3 != 0)) {
        sqlite3ResetAllSchemasOfConnection(db);
      }
    }
    uVar15 = uVar21;
    psVar9 = local_110;
    p_Var10 = local_108;
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
      psVar9 = local_110;
      p_Var10 = local_108;
    }
    break;
  case 0x1b:
    local_58 = 0x3000000010;
    uVar2 = *(ushort *)((long)&local_110->pVfs->pNext + 4);
    uVar15 = uVar21;
    psVar9 = (sqlite3 *)in_RSI;
    p_Var10 = (_func_int_void_ptr_void_ptr *)in_RDX;
    if ((uVar2 & 4) != 0) {
      *(ushort *)((long)&local_110->pVfs->pNext + 4) = uVar2 & 0xffdb | 0x20;
      psVar9 = (sqlite3 *)in_RSI;
      p_Var10 = (_func_int_void_ptr_void_ptr *)in_RDX;
    }
    break;
  case 0x1c:
    local_58 = 0x3000000018;
    sqlite3Config.iPrngSeed = (uint)local_110;
    if ((local_108 != (_func_int_void_ptr_void_ptr *)0x0) &&
       (**(uint **)(*(long *)(local_108 + 0x20) + 0x18) != 0)) {
      sqlite3Config.iPrngSeed = **(uint **)(*(long *)(local_108 + 0x20) + 0x18);
    }
    local_110 = (sqlite3 *)in_RSI;
    local_108 = (_func_int_void_ptr_void_ptr *)in_RDX;
    sqlite3_randomness(0,(void *)0x0);
    uVar15 = 0;
    psVar9 = local_110;
    p_Var10 = local_108;
    break;
  case 0x1d:
    local_58 = 0x3000000010;
    sqlite3Config.bExtraSchemaChecks = (u8)local_110;
    uVar15 = uVar21;
    psVar9 = (sqlite3 *)in_RSI;
    p_Var10 = (_func_int_void_ptr_void_ptr *)in_RDX;
    break;
  case 0x1e:
    local_58 = 0x3000000018;
    *(undefined8 *)local_108 = 0;
    uVar15 = uVar21;
    psVar9 = (sqlite3 *)in_RSI;
    p_Var10 = (_func_int_void_ptr_void_ptr *)in_RDX;
    break;
  case 0x1f:
    local_58 = 0x3000000018;
    uVar15 = uVar21;
    psVar9 = (sqlite3 *)in_RSI;
    p_Var10 = (_func_int_void_ptr_void_ptr *)in_RDX;
    switch((ulong)local_110 & 0xffffffff) {
    case 0:
      uVar14 = sqlite3TreeTrace;
      goto LAB_001300c3;
    case 1:
      sqlite3TreeTrace = *(u32 *)local_108;
      psVar9 = (sqlite3 *)in_RSI;
      p_Var10 = (_func_int_void_ptr_void_ptr *)in_RDX;
      break;
    case 2:
      uVar14 = sqlite3WhereTrace;
LAB_001300c3:
      local_58 = 0x3000000018;
      *(u32 *)local_108 = uVar14;
      uVar15 = uVar21;
      psVar9 = (sqlite3 *)in_RSI;
      p_Var10 = (_func_int_void_ptr_void_ptr *)in_RDX;
      break;
    case 3:
      sqlite3WhereTrace = *(u32 *)local_108;
      psVar9 = (sqlite3 *)in_RSI;
      p_Var10 = (_func_int_void_ptr_void_ptr *)in_RDX;
    }
    break;
  case 0x21:
    local_58 = 0x4000000008;
    if (local_e8 <= 1.0) {
      x_00 = 0;
      local_110 = (sqlite3 *)in_RSI;
      local_108 = (_func_int_void_ptr_void_ptr *)in_RDX;
    }
    else if (local_e8 <= 2000000000.0) {
      local_110 = (sqlite3 *)in_RSI;
      local_108 = (_func_int_void_ptr_void_ptr *)in_RDX;
      x_00 = sqlite3LogEst((long)(local_e8 - 9.223372036854776e+18) & (long)local_e8 >> 0x3f |
                           (long)local_e8);
    }
    else {
      x_00 = (ushort)((ulong)local_e8 >> 0x34) * 10 + -0x27ec;
      local_110 = (sqlite3 *)in_RSI;
      local_108 = (_func_int_void_ptr_void_ptr *)in_RDX;
    }
    uVar18 = local_58 & 0xffffffff;
    if (uVar18 < 0x29) {
      local_58 = CONCAT44(local_58._4_4_,(int)local_58 + 8);
      pPVar17 = (Pgno *)(local_48 + uVar18);
    }
    else {
      pPVar17 = pPStack_50;
      pPStack_50 = pPStack_50 + 2;
    }
    uVar18 = local_58 & 0xffffffff;
    if (uVar18 < 0x29) {
      local_58 = CONCAT44(local_58._4_4_,(int)local_58 + 8);
      pPVar20 = (Pgno *)(local_48 + uVar18);
    }
    else {
      pPVar20 = pPStack_50;
      pPStack_50 = pPStack_50 + 2;
    }
    puVar4 = *(u64 **)pPVar20;
    uVar18 = local_58 & 0xffffffff;
    if (uVar18 < 0x29) {
      local_58 = CONCAT44(local_58._4_4_,(int)local_58 + 8);
      pPVar20 = (Pgno *)(local_48 + uVar18);
    }
    else {
      pPVar20 = pPStack_50;
      pPStack_50 = pPStack_50 + 2;
    }
    piVar5 = *(int **)pPVar20;
    **(int **)pPVar17 = (int)x_00;
    x_01 = sqlite3LogEstToInt(x_00);
    *puVar4 = x_01;
    LVar12 = sqlite3LogEst(x_01);
    *piVar5 = (int)LVar12;
    uVar15 = 0;
    psVar9 = local_110;
    p_Var10 = local_108;
  }
switchD_0012fb58_caseD_e:
  local_108 = p_Var10;
  local_110 = psVar9;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar15;
  }
  __stack_chk_fail();
  while (local_5c = uVar8 + 1, uVar15 = uVar21, (1 - uVar6) + uVar8 != 1) {
LAB_001307b9:
    uVar8 = local_5c;
    bVar11 = *(byte *)((long)p_00 + (ulong)(local_5c >> 3));
    iVar13 = sqlite3BitvecTestNotNull(p,local_5c);
    uVar15 = uVar8;
    if ((iVar13 == 0) == ((bVar11 >> (uVar8 & 7) & 1) != 0)) break;
  }
LAB_0013093e:
  sqlite3_free(p_01);
  sqlite3_free(p_00);
  sqlite3BitvecDestroy(p);
  psVar9 = local_110;
  p_Var10 = local_108;
  goto switchD_0012fb58_caseD_e;
}

Assistant:

SQLITE_API int sqlite3_test_control(int op, ...){
  int rc = 0;
#ifdef SQLITE_UNTESTABLE
  UNUSED_PARAMETER(op);
#else
  va_list ap;
  va_start(ap, op);
  switch( op ){

    /*
    ** Save the current state of the PRNG.
    */
    case SQLITE_TESTCTRL_PRNG_SAVE: {
      sqlite3PrngSaveState();
      break;
    }

    /*
    ** Restore the state of the PRNG to the last state saved using
    ** PRNG_SAVE.  If PRNG_SAVE has never before been called, then
    ** this verb acts like PRNG_RESET.
    */
    case SQLITE_TESTCTRL_PRNG_RESTORE: {
      sqlite3PrngRestoreState();
      break;
    }

    /*  sqlite3_test_control(SQLITE_TESTCTRL_PRNG_SEED, int x, sqlite3 *db);
    **
    ** Control the seed for the pseudo-random number generator (PRNG) that
    ** is built into SQLite.  Cases:
    **
    **    x!=0 && db!=0       Seed the PRNG to the current value of the
    **                        schema cookie in the main database for db, or
    **                        x if the schema cookie is zero.  This case
    **                        is convenient to use with database fuzzers
    **                        as it allows the fuzzer some control over the
    **                        the PRNG seed.
    **
    **    x!=0 && db==0       Seed the PRNG to the value of x.
    **
    **    x==0 && db==0       Revert to default behavior of using the
    **                        xRandomness method on the primary VFS.
    **
    ** This test-control also resets the PRNG so that the new seed will
    ** be used for the next call to sqlite3_randomness().
    */
#ifndef SQLITE_OMIT_WSD
    case SQLITE_TESTCTRL_PRNG_SEED: {
      int x = va_arg(ap, int);
      int y;
      sqlite3 *db = va_arg(ap, sqlite3*);
      assert( db==0 || db->aDb[0].pSchema!=0 );
      if( db && (y = db->aDb[0].pSchema->schema_cookie)!=0 ){ x = y; }
      sqlite3Config.iPrngSeed = x;
      sqlite3_randomness(0,0);
      break;
    }
#endif

    /*  sqlite3_test_control(SQLITE_TESTCTRL_FK_NO_ACTION, sqlite3 *db, int b);
    **
    ** If b is true, then activate the SQLITE_FkNoAction setting.  If b is
    ** false then clearn that setting.  If the SQLITE_FkNoAction setting is
    ** abled, all foreign key ON DELETE and ON UPDATE actions behave as if
    ** they were NO ACTION, regardless of how they are defined.
    **
    ** NB:  One must usually run "PRAGMA writable_schema=RESET" after
    ** using this test-control, before it will take full effect.  failing
    ** to reset the schema can result in some unexpected behavior.
    */
    case SQLITE_TESTCTRL_FK_NO_ACTION: {
      sqlite3 *db = va_arg(ap, sqlite3*);
      int b = va_arg(ap, int);
      if( b ){
        db->flags |= SQLITE_FkNoAction;
      }else{
        db->flags &= ~SQLITE_FkNoAction;
      }
      break;
    }

    /*
    **  sqlite3_test_control(BITVEC_TEST, size, program)
    **
    ** Run a test against a Bitvec object of size.  The program argument
    ** is an array of integers that defines the test.  Return -1 on a
    ** memory allocation error, 0 on success, or non-zero for an error.
    ** See the sqlite3BitvecBuiltinTest() for additional information.
    */
    case SQLITE_TESTCTRL_BITVEC_TEST: {
      int sz = va_arg(ap, int);
      int *aProg = va_arg(ap, int*);
      rc = sqlite3BitvecBuiltinTest(sz, aProg);
      break;
    }

    /*
    **  sqlite3_test_control(FAULT_INSTALL, xCallback)
    **
    ** Arrange to invoke xCallback() whenever sqlite3FaultSim() is called,
    ** if xCallback is not NULL.
    **
    ** As a test of the fault simulator mechanism itself, sqlite3FaultSim(0)
    ** is called immediately after installing the new callback and the return
    ** value from sqlite3FaultSim(0) becomes the return from
    ** sqlite3_test_control().
    */
    case SQLITE_TESTCTRL_FAULT_INSTALL: {
      /* A bug in MSVC prevents it from understanding pointers to functions
      ** types in the second argument to va_arg().  Work around the problem
      ** using a typedef.
      ** http://support.microsoft.com/kb/47961  <-- dead hyperlink
      ** Search at http://web.archive.org/ to find the 2015-03-16 archive
      ** of the link above to see the original text.
      ** sqlite3GlobalConfig.xTestCallback = va_arg(ap, int(*)(int));
      */
      typedef int(*sqlite3FaultFuncType)(int);
      sqlite3GlobalConfig.xTestCallback = va_arg(ap, sqlite3FaultFuncType);
      rc = sqlite3FaultSim(0);
      break;
    }

    /*
    **  sqlite3_test_control(BENIGN_MALLOC_HOOKS, xBegin, xEnd)
    **
    ** Register hooks to call to indicate which malloc() failures
    ** are benign.
    */
    case SQLITE_TESTCTRL_BENIGN_MALLOC_HOOKS: {
      typedef void (*void_function)(void);
      void_function xBenignBegin;
      void_function xBenignEnd;
      xBenignBegin = va_arg(ap, void_function);
      xBenignEnd = va_arg(ap, void_function);
      sqlite3BenignMallocHooks(xBenignBegin, xBenignEnd);
      break;
    }

    /*
    **  sqlite3_test_control(SQLITE_TESTCTRL_PENDING_BYTE, unsigned int X)
    **
    ** Set the PENDING byte to the value in the argument, if X>0.
    ** Make no changes if X==0.  Return the value of the pending byte
    ** as it existing before this routine was called.
    **
    ** IMPORTANT:  Changing the PENDING byte from 0x40000000 results in
    ** an incompatible database file format.  Changing the PENDING byte
    ** while any database connection is open results in undefined and
    ** deleterious behavior.
    */
    case SQLITE_TESTCTRL_PENDING_BYTE: {
      rc = PENDING_BYTE;
#ifndef SQLITE_OMIT_WSD
      {
        unsigned int newVal = va_arg(ap, unsigned int);
        if( newVal ) sqlite3PendingByte = newVal;
      }
#endif
      break;
    }

    /*
    **  sqlite3_test_control(SQLITE_TESTCTRL_ASSERT, int X)
    **
    ** This action provides a run-time test to see whether or not
    ** assert() was enabled at compile-time.  If X is true and assert()
    ** is enabled, then the return value is true.  If X is true and
    ** assert() is disabled, then the return value is zero.  If X is
    ** false and assert() is enabled, then the assertion fires and the
    ** process aborts.  If X is false and assert() is disabled, then the
    ** return value is zero.
    */
    case SQLITE_TESTCTRL_ASSERT: {
      volatile int x = 0;
      assert( /*side-effects-ok*/ (x = va_arg(ap,int))!=0 );
      rc = x;
#if defined(SQLITE_DEBUG)
      /* Invoke these debugging routines so that the compiler does not
      ** issue "defined but not used" warnings. */
      if( x==9999 ){
        sqlite3ShowExpr(0);
        sqlite3ShowExprList(0);
        sqlite3ShowIdList(0);
        sqlite3ShowSrcList(0);
        sqlite3ShowWith(0);
        sqlite3ShowUpsert(0);
#ifndef SQLITE_OMIT_TRIGGER
        sqlite3ShowTriggerStep(0);
        sqlite3ShowTriggerStepList(0);
        sqlite3ShowTrigger(0);
        sqlite3ShowTriggerList(0);
#endif
#ifndef SQLITE_OMIT_WINDOWFUNC
        sqlite3ShowWindow(0);
        sqlite3ShowWinFunc(0);
#endif
        sqlite3ShowSelect(0);
      }
#endif
      break;
    }


    /*
    **  sqlite3_test_control(SQLITE_TESTCTRL_ALWAYS, int X)
    **
    ** This action provides a run-time test to see how the ALWAYS and
    ** NEVER macros were defined at compile-time.
    **
    ** The return value is ALWAYS(X) if X is true, or 0 if X is false.
    **
    ** The recommended test is X==2.  If the return value is 2, that means
    ** ALWAYS() and NEVER() are both no-op pass-through macros, which is the
    ** default setting.  If the return value is 1, then ALWAYS() is either
    ** hard-coded to true or else it asserts if its argument is false.
    ** The first behavior (hard-coded to true) is the case if
    ** SQLITE_TESTCTRL_ASSERT shows that assert() is disabled and the second
    ** behavior (assert if the argument to ALWAYS() is false) is the case if
    ** SQLITE_TESTCTRL_ASSERT shows that assert() is enabled.
    **
    ** The run-time test procedure might look something like this:
    **
    **    if( sqlite3_test_control(SQLITE_TESTCTRL_ALWAYS, 2)==2 ){
    **      // ALWAYS() and NEVER() are no-op pass-through macros
    **    }else if( sqlite3_test_control(SQLITE_TESTCTRL_ASSERT, 1) ){
    **      // ALWAYS(x) asserts that x is true. NEVER(x) asserts x is false.
    **    }else{
    **      // ALWAYS(x) is a constant 1.  NEVER(x) is a constant 0.
    **    }
    */
    case SQLITE_TESTCTRL_ALWAYS: {
      int x = va_arg(ap,int);
      rc = x ? ALWAYS(x) : 0;
      break;
    }

    /*
    **   sqlite3_test_control(SQLITE_TESTCTRL_BYTEORDER);
    **
    ** The integer returned reveals the byte-order of the computer on which
    ** SQLite is running:
    **
    **       1     big-endian,    determined at run-time
    **      10     little-endian, determined at run-time
    **  432101     big-endian,    determined at compile-time
    **  123410     little-endian, determined at compile-time
    */
    case SQLITE_TESTCTRL_BYTEORDER: {
      rc = SQLITE_BYTEORDER*100 + SQLITE_LITTLEENDIAN*10 + SQLITE_BIGENDIAN;
      break;
    }

    /*  sqlite3_test_control(SQLITE_TESTCTRL_OPTIMIZATIONS, sqlite3 *db, int N)
    **
    ** Enable or disable various optimizations for testing purposes.  The
    ** argument N is a bitmask of optimizations to be disabled.  For normal
    ** operation N should be 0.  The idea is that a test program (like the
    ** SQL Logic Test or SLT test module) can run the same SQL multiple times
    ** with various optimizations disabled to verify that the same answer
    ** is obtained in every case.
    */
    case SQLITE_TESTCTRL_OPTIMIZATIONS: {
      sqlite3 *db = va_arg(ap, sqlite3*);
      db->dbOptFlags = va_arg(ap, u32);
      break;
    }

    /*  sqlite3_test_control(SQLITE_TESTCTRL_GETOPT, sqlite3 *db, int *N)
    **
    ** Write the current optimization settings into *N.  A zero bit means that
    ** the optimization is on, and a 1 bit means that the optimization is off.
    */
    case SQLITE_TESTCTRL_GETOPT: {
      sqlite3 *db = va_arg(ap, sqlite3*);
      int *pN = va_arg(ap, int*);
      *pN = db->dbOptFlags;
      break;
    }

    /*   sqlite3_test_control(SQLITE_TESTCTRL_LOCALTIME_FAULT, onoff, xAlt);
    **
    ** If parameter onoff is 1, subsequent calls to localtime() fail.
    ** If 2, then invoke xAlt() instead of localtime().  If 0, normal
    ** processing.
    **
    ** xAlt arguments are void pointers, but they really want to be:
    **
    **    int xAlt(const time_t*, struct tm*);
    **
    ** xAlt should write results in to struct tm object of its 2nd argument
    ** and return zero on success, or return non-zero on failure.
    */
    case SQLITE_TESTCTRL_LOCALTIME_FAULT: {
      sqlite3GlobalConfig.bLocaltimeFault = va_arg(ap, int);
      if( sqlite3GlobalConfig.bLocaltimeFault==2 ){
        typedef int(*sqlite3LocaltimeType)(const void*,void*);
        sqlite3GlobalConfig.xAltLocaltime = va_arg(ap, sqlite3LocaltimeType);
      }else{
        sqlite3GlobalConfig.xAltLocaltime = 0;
      }
      break;
    }

    /*   sqlite3_test_control(SQLITE_TESTCTRL_INTERNAL_FUNCTIONS, sqlite3*);
    **
    ** Toggle the ability to use internal functions on or off for
    ** the database connection given in the argument.
    */
    case SQLITE_TESTCTRL_INTERNAL_FUNCTIONS: {
      sqlite3 *db = va_arg(ap, sqlite3*);
      db->mDbFlags ^= DBFLAG_InternalFunc;
      break;
    }

    /*   sqlite3_test_control(SQLITE_TESTCTRL_NEVER_CORRUPT, int);
    **
    ** Set or clear a flag that indicates that the database file is always well-
    ** formed and never corrupt.  This flag is clear by default, indicating that
    ** database files might have arbitrary corruption.  Setting the flag during
    ** testing causes certain assert() statements in the code to be activated
    ** that demonstrate invariants on well-formed database files.
    */
    case SQLITE_TESTCTRL_NEVER_CORRUPT: {
      sqlite3GlobalConfig.neverCorrupt = va_arg(ap, int);
      break;
    }

    /*   sqlite3_test_control(SQLITE_TESTCTRL_EXTRA_SCHEMA_CHECKS, int);
    **
    ** Set or clear a flag that causes SQLite to verify that type, name,
    ** and tbl_name fields of the sqlite_schema table.  This is normally
    ** on, but it is sometimes useful to turn it off for testing.
    **
    ** 2020-07-22:  Disabling EXTRA_SCHEMA_CHECKS also disables the
    ** verification of rootpage numbers when parsing the schema.  This
    ** is useful to make it easier to reach strange internal error states
    ** during testing.  The EXTRA_SCHEMA_CHECKS setting is always enabled
    ** in production.
    */
    case SQLITE_TESTCTRL_EXTRA_SCHEMA_CHECKS: {
      sqlite3GlobalConfig.bExtraSchemaChecks = va_arg(ap, int);
      break;
    }

    /* Set the threshold at which OP_Once counters reset back to zero.
    ** By default this is 0x7ffffffe (over 2 billion), but that value is
    ** too big to test in a reasonable amount of time, so this control is
    ** provided to set a small and easily reachable reset value.
    */
    case SQLITE_TESTCTRL_ONCE_RESET_THRESHOLD: {
      sqlite3GlobalConfig.iOnceResetThreshold = va_arg(ap, int);
      break;
    }

    /*   sqlite3_test_control(SQLITE_TESTCTRL_VDBE_COVERAGE, xCallback, ptr);
    **
    ** Set the VDBE coverage callback function to xCallback with context
    ** pointer ptr.
    */
    case SQLITE_TESTCTRL_VDBE_COVERAGE: {
#ifdef SQLITE_VDBE_COVERAGE
      typedef void (*branch_callback)(void*,unsigned int,
                                      unsigned char,unsigned char);
      sqlite3GlobalConfig.xVdbeBranch = va_arg(ap,branch_callback);
      sqlite3GlobalConfig.pVdbeBranchArg = va_arg(ap,void*);
#endif
      break;
    }

    /*   sqlite3_test_control(SQLITE_TESTCTRL_SORTER_MMAP, db, nMax); */
    case SQLITE_TESTCTRL_SORTER_MMAP: {
      sqlite3 *db = va_arg(ap, sqlite3*);
      db->nMaxSorterMmap = va_arg(ap, int);
      break;
    }

    /*   sqlite3_test_control(SQLITE_TESTCTRL_ISINIT);
    **
    ** Return SQLITE_OK if SQLite has been initialized and SQLITE_ERROR if
    ** not.
    */
    case SQLITE_TESTCTRL_ISINIT: {
      if( sqlite3GlobalConfig.isInit==0 ) rc = SQLITE_ERROR;
      break;
    }

    /*  sqlite3_test_control(SQLITE_TESTCTRL_IMPOSTER, db, dbName, onOff, tnum);
    **
    ** This test control is used to create imposter tables.  "db" is a pointer
    ** to the database connection.  dbName is the database name (ex: "main" or
    ** "temp") which will receive the imposter.  "onOff" turns imposter mode on
    ** or off.  "tnum" is the root page of the b-tree to which the imposter
    ** table should connect.
    **
    ** Enable imposter mode only when the schema has already been parsed.  Then
    ** run a single CREATE TABLE statement to construct the imposter table in
    ** the parsed schema.  Then turn imposter mode back off again.
    **
    ** If onOff==0 and tnum>0 then reset the schema for all databases, causing
    ** the schema to be reparsed the next time it is needed.  This has the
    ** effect of erasing all imposter tables.
    */
    case SQLITE_TESTCTRL_IMPOSTER: {
      sqlite3 *db = va_arg(ap, sqlite3*);
      int iDb;
      sqlite3_mutex_enter(db->mutex);
      iDb = sqlite3FindDbName(db, va_arg(ap,const char*));
      if( iDb>=0 ){
        db->init.iDb = iDb;
        db->init.busy = db->init.imposterTable = va_arg(ap,int);
        db->init.newTnum = va_arg(ap,int);
        if( db->init.busy==0 && db->init.newTnum>0 ){
          sqlite3ResetAllSchemasOfConnection(db);
        }
      }
      sqlite3_mutex_leave(db->mutex);
      break;
    }

#if defined(YYCOVERAGE)
    /*  sqlite3_test_control(SQLITE_TESTCTRL_PARSER_COVERAGE, FILE *out)
    **
    ** This test control (only available when SQLite is compiled with
    ** -DYYCOVERAGE) writes a report onto "out" that shows all
    ** state/lookahead combinations in the parser state machine
    ** which are never exercised.  If any state is missed, make the
    ** return code SQLITE_ERROR.
    */
    case SQLITE_TESTCTRL_PARSER_COVERAGE: {
      FILE *out = va_arg(ap, FILE*);
      if( sqlite3ParserCoverage(out) ) rc = SQLITE_ERROR;
      break;
    }
#endif /* defined(YYCOVERAGE) */

    /*  sqlite3_test_control(SQLITE_TESTCTRL_RESULT_INTREAL, sqlite3_context*);
    **
    ** This test-control causes the most recent sqlite3_result_int64() value
    ** to be interpreted as a MEM_IntReal instead of as an MEM_Int.  Normally,
    ** MEM_IntReal values only arise during an INSERT operation of integer
    ** values into a REAL column, so they can be challenging to test.  This
    ** test-control enables us to write an intreal() SQL function that can
    ** inject an intreal() value at arbitrary places in an SQL statement,
    ** for testing purposes.
    */
    case SQLITE_TESTCTRL_RESULT_INTREAL: {
      sqlite3_context *pCtx = va_arg(ap, sqlite3_context*);
      sqlite3ResultIntReal(pCtx);
      break;
    }

    /*  sqlite3_test_control(SQLITE_TESTCTRL_SEEK_COUNT,
    **    sqlite3 *db,    // Database connection
    **    u64 *pnSeek     // Write seek count here
    **  );
    **
    ** This test-control queries the seek-counter on the "main" database
    ** file.  The seek-counter is written into *pnSeek and is then reset.
    ** The seek-count is only available if compiled with SQLITE_DEBUG.
    */
    case SQLITE_TESTCTRL_SEEK_COUNT: {
      sqlite3 *db = va_arg(ap, sqlite3*);
      u64 *pn = va_arg(ap, sqlite3_uint64*);
      *pn = sqlite3BtreeSeekCount(db->aDb->pBt);
      (void)db;  /* Silence harmless unused variable warning */
      break;
    }

    /*  sqlite3_test_control(SQLITE_TESTCTRL_TRACEFLAGS, op, ptr)
    **
    **  "ptr" is a pointer to a u32.
    **
    **   op==0       Store the current sqlite3TreeTrace in *ptr
    **   op==1       Set sqlite3TreeTrace to the value *ptr
    **   op==2       Store the current sqlite3WhereTrace in *ptr
    **   op==3       Set sqlite3WhereTrace to the value *ptr
    */
    case SQLITE_TESTCTRL_TRACEFLAGS: {
       int opTrace = va_arg(ap, int);
       u32 *ptr = va_arg(ap, u32*);
       switch( opTrace ){
         case 0:   *ptr = sqlite3TreeTrace;      break;
         case 1:   sqlite3TreeTrace = *ptr;      break;
         case 2:   *ptr = sqlite3WhereTrace;     break;
         case 3:   sqlite3WhereTrace = *ptr;     break;
       }
       break;
    }

    /* sqlite3_test_control(SQLITE_TESTCTRL_LOGEST,
    **      double fIn,     // Input value
    **      int *pLogEst,   // sqlite3LogEstFromDouble(fIn)
    **      u64 *pInt,      // sqlite3LogEstToInt(*pLogEst)
    **      int *pLogEst2   // sqlite3LogEst(*pInt)
    ** );
    **
    ** Test access for the LogEst conversion routines.
    */
    case SQLITE_TESTCTRL_LOGEST: {
      double rIn = va_arg(ap, double);
      LogEst rLogEst = sqlite3LogEstFromDouble(rIn);
      int *pI1 = va_arg(ap,int*);
      u64 *pU64 = va_arg(ap,u64*);
      int *pI2 = va_arg(ap,int*);
      *pI1 = rLogEst;
      *pU64 = sqlite3LogEstToInt(rLogEst);
      *pI2 = sqlite3LogEst(*pU64);
      break;
    }

#if defined(SQLITE_DEBUG) && !defined(SQLITE_OMIT_WSD)
    /* sqlite3_test_control(SQLITE_TESTCTRL_TUNE, id, *piValue)
    **
    ** If "id" is an integer between 1 and SQLITE_NTUNE then set the value
    ** of the id-th tuning parameter to *piValue.  If "id" is between -1
    ** and -SQLITE_NTUNE, then write the current value of the (-id)-th
    ** tuning parameter into *piValue.
    **
    ** Tuning parameters are for use during transient development builds,
    ** to help find the best values for constants in the query planner.
    ** Access tuning parameters using the Tuning(ID) macro.  Set the
    ** parameters in the CLI using ".testctrl tune ID VALUE".
    **
    ** Transient use only.  Tuning parameters should not be used in
    ** checked-in code.
    */
    case SQLITE_TESTCTRL_TUNE: {
      int id = va_arg(ap, int);
      int *piValue = va_arg(ap, int*);
      if( id>0 && id<=SQLITE_NTUNE ){
        Tuning(id) = *piValue;
      }else if( id<0 && id>=-SQLITE_NTUNE ){
        *piValue = Tuning(-id);
      }else{
        rc = SQLITE_NOTFOUND;
      }
      break;
    }
#endif

    /* sqlite3_test_control(SQLITE_TESTCTRL_JSON_SELFCHECK, &onOff);
    **
    ** Activate or deactivate validation of JSONB that is generated from
    ** text.  Off by default, as the validation is slow.  Validation is
    ** only available if compiled using SQLITE_DEBUG.
    **
    ** If onOff is initially 1, then turn it on.  If onOff is initially
    ** off, turn it off.  If onOff is initially -1, then change onOff
    ** to be the current setting.
    */
    case SQLITE_TESTCTRL_JSON_SELFCHECK: {
#if defined(SQLITE_DEBUG) && !defined(SQLITE_OMIT_WSD)
      int *pOnOff = va_arg(ap, int*);
      if( *pOnOff<0 ){
        *pOnOff = sqlite3Config.bJsonSelfcheck;
      }else{
        sqlite3Config.bJsonSelfcheck = (u8)((*pOnOff)&0xff);
      }
#endif
      break;
    }
  }
  va_end(ap);
#endif /* SQLITE_UNTESTABLE */
  return rc;
}